

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void libcmepoll_init_sel_item(_select_item *sel_item)

{
  _select_item *sel_item_local;
  
  sel_item->add_select = libcmepoll_LTX_add_select;
  sel_item->remove_select = libcmepoll_LTX_remove_select;
  sel_item->write_select = libcmepoll_LTX_write_select;
  sel_item->add_periodic = libcmepoll_LTX_add_periodic;
  sel_item->add_delayed_task = libcmepoll_LTX_add_delayed_task;
  sel_item->remove_periodic = libcmepoll_LTX_remove_periodic;
  sel_item->wake_function = libcmepoll_LTX_wake_function;
  sel_item->blocking_function = libcmepoll_LTX_blocking_function;
  sel_item->polling_function = libcmepoll_LTX_polling_function;
  sel_item->initialize = libcmepoll_LTX_select_initialize;
  sel_item->shutdown = libcmepoll_LTX_select_shutdown;
  sel_item->free = libcmepoll_LTX_select_free;
  sel_item->stop = libcmepoll_LTX_select_stop;
  return;
}

Assistant:

extern void
libcmepoll_init_sel_item(struct _select_item *sel_item)
{
    sel_item->add_select = (CMAddSelectFunc)libcmepoll_LTX_add_select;
    sel_item->remove_select = (CMRemoveSelectFunc)libcmepoll_LTX_remove_select;
    sel_item->write_select = (CMAddSelectFunc) libcmepoll_LTX_write_select;
    sel_item->add_periodic = (CMAddPeriodicFunc)libcmepoll_LTX_add_periodic;
    sel_item->add_delayed_task = 
	 (CMAddPeriodicFunc)libcmepoll_LTX_add_delayed_task;
    sel_item->remove_periodic = (CMRemovePeriodicFunc)libcmepoll_LTX_remove_periodic;
    sel_item->wake_function = (CMWakeSelectFunc)libcmepoll_LTX_wake_function;
    sel_item->blocking_function = (CMPollFunc)libcmepoll_LTX_blocking_function;
    sel_item->polling_function =  (CMPollFunc)libcmepoll_LTX_polling_function;
    sel_item->initialize = (SelectInitFunc)libcmepoll_LTX_select_initialize;
    sel_item->shutdown = (SelectInitFunc) libcmepoll_LTX_select_shutdown;
    sel_item->free = (SelectInitFunc) libcmepoll_LTX_select_free;
    sel_item->stop = (CMWakeSelectFunc) libcmepoll_LTX_select_stop;
}